

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lighting.cpp
# Opt level: O2

shared_ptr<Lighting> __thiscall
Lighting::Create(Lighting *this,shared_ptr<EnvironmentMap> *environment_map)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Lighting> sVar2;
  
  std::make_shared<Lighting>();
  std::__shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x10),
             &environment_map->super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>);
  lVar1 = *(long *)this;
  *(undefined8 *)(lVar1 + 4) = 0x40a0000040a00000;
  *(undefined4 *)(lVar1 + 0xc) = 0x40a00000;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Lighting>)sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Lighting> Lighting::Create(const std::shared_ptr<EnvironmentMap> &environment_map) {
	std::shared_ptr<Lighting> ret = std::make_shared<Lighting>();
	ret->m_environment_map_ptr = environment_map;
	ret->m_sun_radiance = glm::vec3(kDefaultConstantColor);

	return ret;
}